

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::objectivec::ValidateObjCClassPrefixes
          (objectivec *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,Options *generation_options,string *out_error)

{
  char cVar1;
  char cVar2;
  uint uVar3;
  undefined8 *puVar4;
  bool bVar5;
  bool bVar6;
  __type _Var7;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var8;
  const_iterator cVar9;
  _Base_ptr p_Var10;
  ostream *poVar11;
  ulong uVar12;
  char *pcVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar14;
  ulong uVar15;
  string prefix;
  string other_package_for_prefix;
  string package;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  expected_package_prefixes;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  pointer local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  objectivec *local_130;
  ulong local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  key_type local_c0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  bVar6 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)files
                          ,"-");
  if (bVar6) {
    return true;
  }
  local_a0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_a0._M_impl.super__Rb_tree_header._M_header;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_a0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_a0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((files->
      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
      )._M_impl.super__Vector_impl_data._M_finish != (pointer)0x0) {
    local_1f8._M_dataplus._M_p = (pointer)&PTR__LineConsumer_004d8c88;
    local_1f8._M_string_length = (size_type)&local_a0;
    bVar6 = ParseSimpleFile((string *)files,(LineConsumer *)&local_1f8,
                            &generation_options->expected_prefixes_path);
    if (!bVar6) {
      bVar6 = false;
      goto LAB_002b01be;
    }
  }
  uVar15 = 0;
  local_130 = this;
  while( true ) {
    uVar12 = *(long *)(this + 8) - *(long *)this >> 3;
    bVar6 = uVar12 <= uVar15;
    if (uVar12 <= uVar15) break;
    _Var8 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      (files[1].
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish,
                       files[1].
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       **(undefined8 **)(*(long *)this + uVar15 * 8));
    if (_Var8._M_current ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        files[1].
        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      puVar4 = *(undefined8 **)(*(long *)this + uVar15 * 8);
      cVar1 = *(char *)&files[6].
                        super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
      cVar2 = *(char *)((long)&files[6].
                               super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                               ._M_impl.super__Vector_impl_data._M_finish + 1);
      uVar3 = *(uint *)(puVar4[0xf] + 0x28);
      local_1b8 = (files->
                  super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      std::__cxx11::string::string
                ((string *)&local_1f8,
                 (string *)(*(ulong *)(puVar4[0xf] + 0x60) & 0xfffffffffffffffe));
      local_128 = uVar15;
      std::__cxx11::string::string((string *)&local_c0,(string *)puVar4[1]);
      cVar9 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&local_a0,&local_c0);
      if ((_Rb_tree_header *)cVar9._M_node == &local_a0._M_impl.super__Rb_tree_header) {
        if ((uVar3 & 8) == 0) {
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          if (cVar2 == '\0') goto LAB_002b00db;
          std::operator+(&local_1b0,"error: \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         *puVar4);
          std::operator+(&local_120,&local_1b0,"\' does not have a required \'option");
          std::operator+(&local_1d8,&local_120," objc_class_prefix\'.");
          std::__cxx11::string::operator=((string *)generation_options,(string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_120);
          pbVar14 = &local_1b0;
LAB_002b00d3:
          std::__cxx11::string::~string((string *)pbVar14);
          goto LAB_002b00d8;
        }
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1f8._M_string_length !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0 && local_1b8 != (pointer)0x0) {
          local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
          local_1d8._M_string_length = 0;
          local_1d8.field_2._M_local_buf[0] = '\0';
          pbVar14 = &local_120;
          for (p_Var10 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
              (_Rb_tree_header *)p_Var10 != &local_a0._M_impl.super__Rb_tree_header;
              p_Var10 = (_Base_ptr)std::_Rb_tree_increment(p_Var10)) {
            _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var10 + 2),&local_1f8);
            if (_Var7) {
              std::__cxx11::string::_M_assign((string *)&local_1d8);
              break;
            }
          }
          if (local_c0._M_string_length == 0) {
            if (local_1d8._M_string_length == 0) {
              poVar11 = std::operator<<((ostream *)&std::cerr,"protoc:0: warning: File \'");
              poVar11 = std::operator<<(poVar11,(string *)*puVar4);
              poVar11 = std::operator<<(poVar11,"\' has no ");
              poVar11 = std::operator<<(poVar11,
                                        "package. Consider adding a new package to the proto and adding \'"
                                       );
              poVar11 = std::operator<<(poVar11,"new.package = ");
              poVar11 = std::operator<<(poVar11,(string *)&local_1f8);
              pcVar13 = "\' to the expected prefixes file (";
            }
            else {
              poVar11 = std::operator<<((ostream *)&std::cerr,"protoc:0: warning: File \'");
              poVar11 = std::operator<<(poVar11,(string *)*puVar4);
              poVar11 = std::operator<<(poVar11,"\' has no package ");
              poVar11 = std::operator<<(poVar11,"and package \'");
              poVar11 = std::operator<<(poVar11,(string *)&local_1d8);
              poVar11 = std::operator<<(poVar11,"\' already uses \'");
              poVar11 = std::operator<<(poVar11,(string *)&local_1f8);
              poVar11 = std::operator<<(poVar11,
                                        "\' as its prefix. Consider either adding a new package ");
              poVar11 = std::operator<<(poVar11,
                                        "to the proto, or reusing one of the packages already using this "
                                       );
              pcVar13 = "prefix in the expected prefixes file (";
            }
            poVar11 = std::operator<<(poVar11,pcVar13);
            poVar11 = std::operator<<(poVar11,(string *)files);
            poVar11 = std::operator<<(poVar11,").");
            std::endl<char,std::char_traits<char>>(poVar11);
            std::ostream::flush();
            pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
LAB_002afe49:
            bVar5 = false;
          }
          else {
            if (local_1d8._M_string_length != 0) {
              std::operator+(&local_70,"error: Found \'option objc_class_prefix = \"",&local_1f8);
              std::operator+(&local_100,&local_70,"\";\' in \'");
              std::operator+(&local_50,&local_100,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             *puVar4);
              std::operator+(&local_e0,&local_50,"\'; that prefix is already used for \'package ");
              std::operator+(&local_190,&local_e0,&local_1d8);
              std::operator+(&local_170,&local_190,";\'. It can only be reused by listing ");
              std::operator+(&local_150,&local_170,"it in the expected file (");
              std::operator+(&local_1b0,&local_150,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             files);
              std::operator+(pbVar14,&local_1b0,").");
              std::__cxx11::string::operator=((string *)generation_options,(string *)pbVar14);
              std::__cxx11::string::~string((string *)pbVar14);
              std::__cxx11::string::~string((string *)&local_1b0);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&local_170);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)&local_e0);
              std::__cxx11::string::~string((string *)&local_50);
              std::__cxx11::string::~string((string *)&local_100);
              std::__cxx11::string::~string((string *)&local_70);
              pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
              goto LAB_002afe49;
            }
            bVar5 = true;
          }
          std::__cxx11::string::~string((string *)&local_1d8);
          if (!bVar5) goto LAB_002b00db;
        }
        if ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)local_1f8._M_string_length !=
            (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)0x0) {
          if (0x19 < (byte)(*local_1f8._M_dataplus._M_p + 0xbfU)) {
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      "protoc:0: warning: Invalid \'option objc_class_prefix = \"");
            poVar11 = std::operator<<(poVar11,(string *)&local_1f8);
            poVar11 = std::operator<<(poVar11,"\";\' in \'");
            poVar11 = std::operator<<(poVar11,(string *)*puVar4);
            poVar11 = std::operator<<(poVar11,"\';");
            poVar11 = std::operator<<(poVar11," it should start with a capital letter.");
            std::endl<char,std::char_traits<char>>(poVar11);
            std::ostream::flush();
          }
          if ((undefined1 *)
              ((long)&(((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)(local_1f8._M_string_length + -0x30))->_M_impl).super__Rb_tree_header.
                      _M_node_count + 7U) < (undefined1 *)0x2) {
            poVar11 = std::operator<<((ostream *)&std::cerr,
                                      "protoc:0: warning: Invalid \'option objc_class_prefix = \"");
            poVar11 = std::operator<<(poVar11,(string *)&local_1f8);
            poVar11 = std::operator<<(poVar11,"\";\' in \'");
            poVar11 = std::operator<<(poVar11,(string *)*puVar4);
            poVar11 = std::operator<<(poVar11,"\';");
            poVar11 = std::operator<<(poVar11,
                                      " Apple recommends they should be at least 3 characters long."
                                     );
            std::endl<char,std::char_traits<char>>(poVar11);
            std::ostream::flush();
          }
        }
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
        if (local_1b8 != (pointer)0x0) {
          if (cVar1 != '\0') {
            std::operator+(&local_100,"error: \'",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           *puVar4);
            std::operator+(&local_50,&local_100,"\' has \'option objc_class_prefix = \"");
            std::operator+(&local_e0,&local_50,&local_1f8);
            std::operator+(&local_190,&local_e0,
                           "\";\', but it is not registered; add it to the expected ");
            std::operator+(&local_170,&local_190,"prefixes file (");
            std::operator+(&local_150,&local_170,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           files);
            std::operator+(&local_1b0,&local_150,") for the package \'");
            std::operator+(&local_120,&local_1b0,&local_c0);
            std::operator+(&local_1d8,&local_120,"\'.");
            std::__cxx11::string::operator=((string *)generation_options,(string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_1d8);
            std::__cxx11::string::~string((string *)&local_120);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_150);
            std::__cxx11::string::~string((string *)&local_170);
            std::__cxx11::string::~string((string *)&local_190);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_50);
            pbVar14 = &local_100;
            goto LAB_002b00d3;
          }
          poVar11 = std::operator<<((ostream *)&std::cerr,
                                    "protoc:0: warning: Found unexpected \'option objc_class_prefix = \""
                                   );
          poVar11 = std::operator<<(poVar11,(string *)&local_1f8);
          poVar11 = std::operator<<(poVar11,"\";\' in \'");
          poVar11 = std::operator<<(poVar11,(string *)*puVar4);
          poVar11 = std::operator<<(poVar11,"\';");
          poVar11 = std::operator<<(poVar11," consider adding it to the expected prefixes file (");
          poVar11 = std::operator<<(poVar11,(string *)files);
          poVar11 = std::operator<<(poVar11,").");
          std::endl<char,std::char_traits<char>>(poVar11);
          std::ostream::flush();
        }
      }
      else {
        if ((uVar3 & 8) != 0) {
          _Var7 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)(cVar9._M_node + 2),&local_1f8);
          pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
          if (_Var7) goto LAB_002b00db;
        }
        std::operator+(&local_190,"error: Expected \'option objc_class_prefix = \"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (cVar9._M_node + 2));
        std::operator+(&local_170,&local_190,"\";\' for package \'");
        std::operator+(&local_150,&local_170,&local_c0);
        std::operator+(&local_1b0,&local_150,"\' in \'");
        std::operator+(&local_120,&local_1b0,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)*puVar4)
        ;
        std::operator+(&local_1d8,&local_120,"\'");
        std::__cxx11::string::operator=((string *)generation_options,(string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_1d8);
        std::__cxx11::string::~string((string *)&local_120);
        std::__cxx11::string::~string((string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_150);
        std::__cxx11::string::~string((string *)&local_170);
        std::__cxx11::string::~string((string *)&local_190);
        if ((uVar3 & 8) != 0) {
          std::operator+(&local_120,"; but found \'",&local_1f8);
          std::operator+(&local_1d8,&local_120,"\' instead");
          std::__cxx11::string::append((string *)generation_options);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_120);
        }
        std::__cxx11::string::append((char *)generation_options);
LAB_002b00d8:
        pbVar14 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      }
LAB_002b00db:
      std::__cxx11::string::~string((string *)&local_c0);
      std::__cxx11::string::~string((string *)&local_1f8);
      this = local_130;
      uVar15 = local_128;
      if (((ulong)pbVar14 & 1) == 0) goto LAB_002b01be;
    }
    uVar15 = uVar15 + 1;
  }
  bVar6 = true;
LAB_002b01be:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_a0);
  return bVar6;
}

Assistant:

bool ValidateObjCClassPrefixes(const std::vector<const FileDescriptor*>& files,
                               const Options& generation_options,
                               std::string* out_error) {
  // Allow a '-' as the path for the expected prefixes to completely disable
  // even the most basic of checks.
  if (generation_options.expected_prefixes_path == "-") {
    return true;
  }

  // Load the expected package prefixes, if available, to validate against.
  std::map<std::string, std::string> expected_package_prefixes;
  if (!LoadExpectedPackagePrefixes(generation_options,
                                   &expected_package_prefixes,
                                   out_error)) {
    return false;
  }

  for (int i = 0; i < files.size(); i++) {
    bool should_skip =
      (std::find(generation_options.expected_prefixes_suppressions.begin(),
                 generation_options.expected_prefixes_suppressions.end(),
                 files[i]->name())
          != generation_options.expected_prefixes_suppressions.end());
    if (should_skip) {
      continue;
    }

    bool is_valid =
        ValidateObjCClassPrefix(files[i],
                                generation_options.expected_prefixes_path,
                                expected_package_prefixes,
                                generation_options.prefixes_must_be_registered,
                                generation_options.require_prefixes,
                                out_error);
    if (!is_valid) {
      return false;
    }
  }
  return true;
}